

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_ttySetRaw(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  int fd;
  termios tty;
  int local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  cc_t local_5e;
  cc_t local_5d;
  int32_t *in_stack_ffffffffffffffa8;
  JSContext *in_stack_ffffffffffffffb0;
  JSValue in_stack_ffffffffffffffb8;
  undefined4 uStack_c;
  undefined8 local_8;
  
  iVar2 = JS_ToInt32(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb8);
  if (iVar2 == 0) {
    memset(&local_74,0,0x3c);
    tcgetattr(local_78,(termios *)&local_74);
    memcpy(&oldtty,&local_74,0x3c);
    local_74 = local_74 & 0xfffffa14;
    local_70 = local_70 | 1;
    local_68 = local_68 & 0xffff7fb5;
    local_6c = local_6c & 0xfffffecf | 0x30;
    local_5d = '\x01';
    local_5e = '\0';
    tcsetattr(local_78,0,(termios *)&local_74);
    atexit(term_exit);
    local_8 = 3;
  }
  else {
    local_8 = 6;
  }
  auVar1._4_8_ = local_8;
  auVar1._0_4_ = uStack_c;
  auVar1._12_4_ = 0;
  return (JSValue)(auVar1 << 0x20);
}

Assistant:

static JSValue js_os_ttySetRaw(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    struct termios tty;
    int fd;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    
    memset(&tty, 0, sizeof(tty));
    tcgetattr(fd, &tty);
    oldtty = tty;

    tty.c_iflag &= ~(IGNBRK|BRKINT|PARMRK|ISTRIP
                          |INLCR|IGNCR|ICRNL|IXON);
    tty.c_oflag |= OPOST;
    tty.c_lflag &= ~(ECHO|ECHONL|ICANON|IEXTEN);
    tty.c_cflag &= ~(CSIZE|PARENB);
    tty.c_cflag |= CS8;
    tty.c_cc[VMIN] = 1;
    tty.c_cc[VTIME] = 0;

    tcsetattr(fd, TCSANOW, &tty);

    atexit(term_exit);
    return JS_UNDEFINED;
}